

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codewriter_p.h
# Opt level: O1

Error __thiscall asmjit::v1_14::CodeWriter::ensureSpace(CodeWriter *this,BaseAssembler *a,size_t n)

{
  Error err;
  Error EVar1;
  uint8_t *puVar2;
  
  if ((ulong)((long)a->_bufferEnd - (long)this->_cursor) < n) {
    err = CodeHolder::growBuffer((a->super_BaseEmitter)._code,&a->_section->_buffer,n);
    if (err == 0) {
      puVar2 = a->_bufferPtr;
      this->_cursor = puVar2;
    }
    else {
      EVar1 = BaseEmitter::reportError(&a->super_BaseEmitter,err,(char *)0x0);
      puVar2 = (uint8_t *)(ulong)EVar1;
    }
    if (err != 0) {
      return (Error)puVar2;
    }
  }
  return 0;
}

Assistant:

ASMJIT_FORCE_INLINE Error ensureSpace(BaseAssembler* a, size_t n) noexcept {
    size_t remainingSpace = (size_t)(a->_bufferEnd - _cursor);
    if (ASMJIT_UNLIKELY(remainingSpace < n)) {
      CodeBuffer& buffer = a->_section->_buffer;
      Error err = a->_code->growBuffer(&buffer, n);
      if (ASMJIT_UNLIKELY(err))
        return a->reportError(err);
      _cursor = a->_bufferPtr;
    }
    return kErrorOk;
  }